

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_expr.hpp
# Opt level: O0

void __thiscall
viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>_>::rt_unary_expr
          (rt_unary_expr<viennamath::rt_expression_interface<double>_> *this,
          rt_unary_expr<viennamath::rt_expression_interface<double>_> *other)

{
  int iVar1;
  element_type *peVar2;
  undefined4 extraout_var;
  element_type *peVar3;
  undefined4 extraout_var_00;
  rt_unary_expr<viennamath::rt_expression_interface<double>_> *other_local;
  rt_unary_expr<viennamath::rt_expression_interface<double>_> *this_local;
  
  rt_expression_interface<double>::rt_expression_interface
            (&this->super_rt_expression_interface<double>);
  (this->super_rt_expression_interface<double>)._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_unary_expr_00158268;
  peVar2 = std::auto_ptr<viennamath::rt_expression_interface<double>_>::operator->(&other->expr_);
  iVar1 = (*peVar2->_vptr_rt_expression_interface[2])();
  std::auto_ptr<viennamath::rt_expression_interface<double>_>::auto_ptr
            (&this->expr_,(element_type *)CONCAT44(extraout_var,iVar1));
  peVar3 = std::auto_ptr<viennamath::op_interface<viennamath::rt_expression_interface<double>_>_>::
           operator->(&other->op_);
  iVar1 = (*peVar3->_vptr_op_interface[2])();
  std::auto_ptr<viennamath::op_interface<viennamath::rt_expression_interface<double>_>_>::auto_ptr
            (&this->op_,(element_type *)CONCAT44(extraout_var_00,iVar1));
  return;
}

Assistant:

rt_unary_expr(rt_unary_expr const & other) : expr_(other.expr_->clone()),
                                             op_(other.op_->clone()) {}